

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O3

uint32_t TIFFComputeTile(TIFF *tif,uint32_t x,uint32_t y,uint32_t z,uint16_t s)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  
  uVar2 = (tif->tif_dir).td_imagedepth;
  uVar9 = (tif->tif_dir).td_tilewidth;
  uVar8 = (tif->tif_dir).td_tilelength;
  uVar5 = 0;
  if (uVar2 != 1) {
    uVar5 = z;
  }
  if (uVar9 == 0xffffffff) {
    uVar9 = (tif->tif_dir).td_imagewidth;
  }
  uVar1 = (tif->tif_dir).td_tiledepth;
  if (uVar8 == 0xffffffff) {
    uVar8 = (tif->tif_dir).td_imagelength;
  }
  if (uVar1 == 0xffffffff) {
    uVar1 = uVar2;
  }
  uVar3 = 1;
  if (uVar1 != 0 && (uVar8 != 0 && uVar9 != 0)) {
    uVar4 = (tif->tif_dir).td_imagewidth;
    uVar7 = 0;
    uVar6 = 0;
    if (uVar4 < -uVar9) {
      uVar6 = ((uVar4 + uVar9) - 1) / uVar9;
    }
    uVar4 = (tif->tif_dir).td_imagelength;
    if (uVar4 < -uVar8) {
      uVar7 = ((uVar4 + uVar8) - 1) / uVar8;
    }
    uVar4 = 0;
    if (uVar2 < -uVar1) {
      uVar4 = ((uVar1 + uVar2) - 1) / uVar1;
    }
    if ((tif->tif_dir).td_planarconfig == 2) {
      uVar2 = y / uVar8;
      uVar7 = (uVar5 / uVar1 + uVar4 * s) * uVar7;
    }
    else {
      uVar2 = (uVar5 / uVar1) * uVar7;
      uVar7 = y / uVar8;
    }
    uVar3 = (uVar7 + uVar2) * uVar6 + x / uVar9;
  }
  return uVar3;
}

Assistant:

uint32_t TIFFComputeTile(TIFF *tif, uint32_t x, uint32_t y, uint32_t z,
                         uint16_t s)
{
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t dx = td->td_tilewidth;
    uint32_t dy = td->td_tilelength;
    uint32_t dz = td->td_tiledepth;
    uint32_t tile = 1;

    if (td->td_imagedepth == 1)
        z = 0;
    if (dx == (uint32_t)-1)
        dx = td->td_imagewidth;
    if (dy == (uint32_t)-1)
        dy = td->td_imagelength;
    if (dz == (uint32_t)-1)
        dz = td->td_imagedepth;
    if (dx != 0 && dy != 0 && dz != 0)
    {
        uint32_t xpt = TIFFhowmany_32(td->td_imagewidth, dx);
        uint32_t ypt = TIFFhowmany_32(td->td_imagelength, dy);
        uint32_t zpt = TIFFhowmany_32(td->td_imagedepth, dz);

        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
            tile = (xpt * ypt * zpt) * s + (xpt * ypt) * (z / dz) +
                   xpt * (y / dy) + x / dx;
        else
            tile = (xpt * ypt) * (z / dz) + xpt * (y / dy) + x / dx;
    }
    return (tile);
}